

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::CodedOutputStreamFieldSkipper::SkipUnknownEnum
          (CodedOutputStreamFieldSkipper *this,int field_number,int value)

{
  io::CodedOutputStream::WriteVarint32(this->unknown_fields_,field_number);
  io::CodedOutputStream::WriteVarint64(this->unknown_fields_,(long)value);
  return;
}

Assistant:

void CodedOutputStreamFieldSkipper::SkipUnknownEnum(
    int field_number, int value) {
  unknown_fields_->WriteVarint32(field_number);
  unknown_fields_->WriteVarint64(value);
}